

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O3

future<rlottie::Surface> __thiscall
AnimationImpl::renderAsync(AnimationImpl *this,size_t frameNo,Surface *surface,bool keepAspectRatio)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  element_type *peVar10;
  _Ptr_type _Var11;
  undefined8 *puVar12;
  RenderTaskScheduler *task;
  undefined7 in_register_00000009;
  undefined8 *puVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined1 in_R8B;
  future<rlottie::Surface> fVar15;
  promise<rlottie::Surface> local_68;
  promise<rlottie::Surface> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  
  puVar13 = (undefined8 *)CONCAT71(in_register_00000009,keepAspectRatio);
  if (*(long *)(frameNo + 0x20) == 0) {
    puVar12 = (undefined8 *)operator_new(0x90);
    puVar12[1] = 0x100000001;
    *puVar12 = &PTR___Sp_counted_ptr_inplace_00144d38;
    RenderTask::RenderTask((RenderTask *)(puVar12 + 2));
    *(RenderTask **)(frameNo + 0x20) = (RenderTask *)(puVar12 + 2);
    _Var14._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(frameNo + 0x28);
    *(undefined8 **)(frameNo + 0x28) = puVar12;
  }
  else {
    std::promise<rlottie::Surface>::promise(&local_48);
    _Var11._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_false>._M_head_impl =
         local_48._M_storage._M_t.
         super___uniq_ptr_impl<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_std::__future_base::_Result_base::_Deleter>
         .super__Head_base<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_false>._M_head_impl
    ;
    _Var14._M_pi = local_48._M_future.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
    peVar10 = local_48._M_future.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    puVar12 = *(undefined8 **)(frameNo + 0x20);
    local_48._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(__uniq_ptr_impl<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter>
            )0x0;
    local_68._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*puVar12;
    local_68._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar12[1];
    local_68._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_false>._M_head_impl =
         *(__uniq_ptr_data<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter,_true,_true>
           *)&((_Tuple_impl<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_std::__future_base::_Result_base::_Deleter>
                *)(puVar12 + 2))->
              super__Head_base<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_false>;
    *puVar12 = peVar10;
    puVar12[1] = _Var14._M_pi;
    ((__uniq_ptr_impl<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter>
      *)(puVar12 + 2))->_M_t =
         (tuple<std::__future_base::_Result<rlottie::Surface>_*,_std::__future_base::_Result_base::_Deleter>
          )_Var11._M_t.
           super___uniq_ptr_impl<std::__future_base::_Result<rlottie::Surface>,_std::__future_base::_Result_base::_Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_std::__future_base::_Result_base::_Deleter>
           .super__Head_base<0UL,_std::__future_base::_Result<rlottie::Surface>_*,_false>.
           _M_head_impl;
    std::promise<rlottie::Surface>::~promise(&local_68);
    std::promise<rlottie::Surface>::~promise(&local_48);
    std::__basic_future<rlottie::Surface>::__basic_future
              ((__basic_future<rlottie::Surface> *)&local_68,*(__state_type **)(frameNo + 0x20));
    _Var14._M_pi = local_68._M_future.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
    peVar10 = local_68._M_future.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    lVar1 = *(long *)(frameNo + 0x20);
    local_68._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
    *(element_type **)(lVar1 + 0x18) = peVar10;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20) = _Var14._M_pi;
    if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0013cb4e;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    _Var14._M_pi = local_68._M_future.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
  }
  if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
  }
LAB_0013cb4e:
  lVar1 = *(long *)(frameNo + 0x20);
  *(size_t *)(lVar1 + 0x28) = frameNo;
  *(Surface **)(lVar1 + 0x30) = surface;
  uVar3 = puVar13[1];
  uVar4 = puVar13[2];
  uVar5 = puVar13[3];
  uVar6 = puVar13[4];
  uVar7 = puVar13[5];
  uVar8 = puVar13[6];
  uVar9 = puVar13[7];
  *(undefined8 *)(lVar1 + 0x38) = *puVar13;
  *(undefined8 *)(lVar1 + 0x40) = uVar3;
  *(undefined8 *)(lVar1 + 0x48) = uVar4;
  *(undefined8 *)(lVar1 + 0x50) = uVar5;
  *(undefined8 *)(lVar1 + 0x58) = uVar6;
  *(undefined8 *)(lVar1 + 0x60) = uVar7;
  *(undefined8 *)(lVar1 + 0x68) = uVar8;
  *(undefined8 *)(lVar1 + 0x70) = uVar9;
  *(undefined1 *)(*(long *)(frameNo + 0x20) + 0x78) = in_R8B;
  task = RenderTaskScheduler::instance();
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(frameNo + 0x28);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  fVar15 = RenderTaskScheduler::process((RenderTaskScheduler *)this,(SharedRenderTask *)task);
  _Var14._M_pi = fVar15.super___basic_future<rlottie::Surface>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    _Var14._M_pi = extraout_RDX;
  }
  fVar15.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var14._M_pi;
  fVar15.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<rlottie::Surface>)
         fVar15.super___basic_future<rlottie::Surface>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<Surface> AnimationImpl::renderAsync(size_t    frameNo,
                                                Surface &&surface,
                                                bool      keepAspectRatio)
{
    if (!mTask) {
        mTask = std::make_shared<RenderTask>();
    } else {
        mTask->sender = std::promise<Surface>();
        mTask->receiver = mTask->sender.get_future();
    }
    mTask->playerImpl = this;
    mTask->frameNo = frameNo;
    mTask->surface = std::move(surface);
    mTask->keepAspectRatio = keepAspectRatio;

    return RenderTaskScheduler::instance().process(mTask);
}